

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *name)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  
  if ((name->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/document.h"
                  ,0x4e3,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if (((byte)in_RDX[0xf] & 4) == 0) {
    __assert_fail("name.IsString()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/document.h"
                  ,0x4e4,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)((ulong)(name->data_).s.str & 0xffffffffffff);
  while( true ) {
    if ((name->data_).f.flags != 3) {
      *(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        **)this = rhs;
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/document.h"
                    ,0x48e,
                    "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (rhs == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((ulong)(name->data_).s.length * 0x20 +
                  ((ulong)(name->data_).s.str & 0xffffffffffff))) break;
    bVar1 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(in_RDX,rhs);
    if (bVar1) break;
    rhs = rhs + 2;
  }
  *(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> **
   )this = rhs;
  return (MemberIterator)(Pointer)this;
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }